

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  int iVar1;
  long lVar2;
  Type TVar3;
  size_type sVar4;
  OneofDescriptor *pOVar5;
  int i_2;
  int i_5;
  int iVar6;
  undefined4 in_register_00000034;
  long lVar7;
  int i_4;
  long lVar8;
  int i;
  long lVar9;
  long lVar10;
  SubstituteArg local_320;
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  ulong local_200;
  string prefix;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  string local_e8;
  SourceLocationCommentPrinter comment_printer;
  
  local_200 = CONCAT44(in_register_00000034,depth);
  if (*(char *)(*(long *)(this + 0x20) + 0x4b) == '\0') {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      groups._M_t._M_impl._0_8_ = prefix._M_dataplus._M_p;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)prefix._M_string_length;
      local_1a8.text_ = (char *)**(undefined8 **)(this + 8);
      local_1a8.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1d8.text_ = (char *)0x0;
      local_1d8.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      local_290.text_ = (char *)0x0;
      local_290.size_ = -1;
      local_2c0.text_ = (char *)0x0;
      local_2c0.size_ = -1;
      local_2f0.text_ = (char *)0x0;
      local_2f0.size_ = -1;
      local_320.text_ = (char *)0x0;
      local_320.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0message $1",(SubstituteArg *)&groups,&local_1a8,&local_148,&local_1d8,
                 &local_178,&local_260,&local_290,&local_2c0,&local_2f0,&local_320);
    }
    std::__cxx11::string::append((char *)contents);
    iVar6 = (int)local_200 + 1;
    anon_unknown_1::FormatLineOptions
              (iVar6,*(Message **)(this + 0x20),*(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),
               contents);
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &groups._M_t._M_impl.super__Rb_tree_header._M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar8 = 0;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar9 = 0; lVar9 < *(int *)(this + 4); lVar9 = lVar9 + 1) {
      TVar3 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(this + 0x28) + lVar8));
      if (TVar3 == TYPE_GROUP) {
        local_1a8.text_ =
             (char *)FieldDescriptor::message_type
                               ((FieldDescriptor *)(*(long *)(this + 0x28) + lVar8));
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_1a8);
      }
      lVar8 = lVar8 + 0x48;
    }
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < *(int *)(this + 0x7c); lVar9 = lVar9 + 1) {
      TVar3 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(this + 0x50) + lVar8));
      if (TVar3 == TYPE_GROUP) {
        local_1a8.text_ =
             (char *)FieldDescriptor::message_type
                               ((FieldDescriptor *)(*(long *)(this + 0x50) + lVar8));
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_1a8);
      }
      lVar8 = lVar8 + 0x48;
    }
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(this + 0x70); lVar8 = lVar8 + 1) {
      local_1a8.text_ = (char *)(*(long *)(this + 0x38) + lVar9);
      sVar4 = std::
              set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::count(&groups,(key_type *)&local_1a8);
      if (sVar4 == 0) {
        DebugString((Descriptor *)(*(long *)(this + 0x38) + lVar9),iVar6,contents,
                    debug_string_options,true);
      }
      lVar9 = lVar9 + 0x88;
    }
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < *(int *)(this + 0x74); lVar9 = lVar9 + 1) {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x40) + lVar8),iVar6,contents,
                 debug_string_options);
      lVar8 = lVar8 + 0x48;
    }
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(this + 4); lVar8 = lVar8 + 1) {
      pOVar5 = FieldDescriptor::real_containing_oneof
                         ((FieldDescriptor *)(*(long *)(this + 0x28) + lVar9));
      lVar10 = *(long *)(this + 0x28);
      if (pOVar5 == (OneofDescriptor *)0x0) {
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(lVar10 + lVar9),iVar6,contents,debug_string_options);
      }
      else {
        if ((*(byte *)(lVar10 + 1 + lVar9) & 0x10) == 0) {
          pOVar5 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar5 = *(OneofDescriptor **)(lVar10 + 0x28 + lVar9);
        }
        if ((FieldDescriptor *)(lVar10 + lVar9) == *(FieldDescriptor **)(pOVar5 + 0x20)) {
          OneofDescriptor::DebugString(pOVar5,iVar6,contents,debug_string_options);
        }
      }
      lVar9 = lVar9 + 0x48;
    }
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(this + 0x78); lVar8 = lVar8 + 1) {
      local_1a8.text_ = prefix._M_dataplus._M_p;
      local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
      strings::internal::SubstituteArg::SubstituteArg
                (&local_148,*(int *)(*(long *)(this + 0x48) + lVar9));
      strings::internal::SubstituteArg::SubstituteArg
                (&local_1d8,*(int *)(*(long *)(this + 0x48) + 4 + lVar9) + -1);
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      local_290.text_ = (char *)0x0;
      local_290.size_ = -1;
      local_2c0.text_ = (char *)0x0;
      local_2c0.size_ = -1;
      local_2f0.text_ = (char *)0x0;
      local_2f0.size_ = -1;
      local_320.text_ = (char *)0x0;
      local_320.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_230.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  extensions $1 to $2;\n",&local_1a8,&local_148,&local_1d8,&local_178,
                 &local_260,&local_290,&local_2c0,&local_2f0,&local_320,&local_230);
      lVar9 = lVar9 + 0x10;
    }
    local_200 = (ulong)((int)local_200 + 2);
    lVar10 = 0;
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < *(int *)(this + 0x7c); lVar9 = lVar9 + 1) {
      lVar7 = *(long *)(this + 0x50);
      lVar2 = *(long *)(lVar7 + 0x20 + lVar10);
      if (lVar2 != lVar8) {
        lVar8 = lVar2;
        if (lVar10 != 0) {
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_1d8.text_ = (char *)0x0;
          local_1d8.size_ = -1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_290.text_ = (char *)0x0;
          local_290.size_ = -1;
          local_2c0.text_ = (char *)0x0;
          local_2c0.size_ = -1;
          local_2f0.text_ = (char *)0x0;
          local_2f0.size_ = -1;
          local_320.text_ = (char *)0x0;
          local_1a8.text_ = prefix._M_dataplus._M_p;
          local_320.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
          local_230.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  }\n",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                     &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
          lVar8 = *(long *)(*(long *)(this + 0x50) + 0x20 + lVar10);
        }
        local_1a8.text_ = prefix._M_dataplus._M_p;
        local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_148.text_ = *(char **)(*(long *)(lVar8 + 8) + 0x20);
        local_148.size_ = *(int *)(*(long *)(lVar8 + 8) + 0x28);
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_260.text_ = (char *)0x0;
        local_260.size_ = -1;
        local_290.text_ = (char *)0x0;
        local_290.size_ = -1;
        local_2c0.text_ = (char *)0x0;
        local_2c0.size_ = -1;
        local_2f0.text_ = (char *)0x0;
        local_2f0.size_ = -1;
        local_320.text_ = (char *)0x0;
        local_320.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extend .$1 {\n",&local_1a8,&local_148,&local_1d8,&local_178,
                   &local_260,&local_290,&local_2c0,&local_2f0,&local_320,&local_230);
        lVar7 = *(long *)(this + 0x50);
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(lVar7 + lVar10),(int)local_200,contents,debug_string_options);
      lVar10 = lVar10 + 0x48;
    }
    if (0 < *(int *)(this + 0x7c)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1d8.text_ = (char *)0x0;
      local_1d8.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      local_290.text_ = (char *)0x0;
      local_290.size_ = -1;
      local_2c0.text_ = (char *)0x0;
      local_2c0.size_ = -1;
      local_2f0.text_ = (char *)0x0;
      local_2f0.size_ = -1;
      local_320.text_ = (char *)0x0;
      local_1a8.text_ = prefix._M_dataplus._M_p;
      local_320.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_230.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  }\n",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                 &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
    }
    if (0 < *(int *)(this + 0x80)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1d8.text_ = (char *)0x0;
      local_1d8.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      local_290.text_ = (char *)0x0;
      local_290.size_ = -1;
      local_2c0.text_ = (char *)0x0;
      local_2c0.size_ = -1;
      local_2f0.text_ = (char *)0x0;
      local_2f0.size_ = -1;
      local_320.text_ = (char *)0x0;
      local_1a8.text_ = prefix._M_dataplus._M_p;
      local_320.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_230.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                 &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
      for (lVar8 = 0; lVar8 < *(int *)(this + 0x80); lVar8 = lVar8 + 1) {
        lVar9 = *(long *)(this + 0x58);
        iVar6 = *(int *)(lVar9 + lVar8 * 8);
        iVar1 = *(int *)(lVar9 + 4 + lVar8 * 8);
        if (iVar1 == iVar6 + 1) {
          strings::internal::SubstituteArg::SubstituteArg(&local_1a8,iVar6);
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_1d8.text_ = (char *)0x0;
          local_1d8.size_ = -1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_290.text_ = (char *)0x0;
          local_290.size_ = -1;
          local_2c0.text_ = (char *)0x0;
          local_2c0.size_ = -1;
          local_2f0.text_ = (char *)0x0;
          local_2f0.size_ = -1;
          local_320.text_ = (char *)0x0;
          local_320.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0, ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                     &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
        }
        else if (iVar1 < 0x20000000) {
          strings::internal::SubstituteArg::SubstituteArg(&local_1a8,iVar6);
          strings::internal::SubstituteArg::SubstituteArg
                    (&local_148,*(int *)(lVar9 + 4 + lVar8 * 8) + -1);
          local_1d8.text_ = (char *)0x0;
          local_1d8.size_ = -1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_290.text_ = (char *)0x0;
          local_290.size_ = -1;
          local_2c0.text_ = (char *)0x0;
          local_2c0.size_ = -1;
          local_2f0.text_ = (char *)0x0;
          local_2f0.size_ = -1;
          local_320.text_ = (char *)0x0;
          local_320.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0 to $1, ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                     &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
        }
        else {
          strings::internal::SubstituteArg::SubstituteArg(&local_1a8,iVar6);
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_1d8.text_ = (char *)0x0;
          local_1d8.size_ = -1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_290.text_ = (char *)0x0;
          local_290.size_ = -1;
          local_2c0.text_ = (char *)0x0;
          local_2c0.size_ = -1;
          local_2f0.text_ = (char *)0x0;
          local_2f0.size_ = -1;
          local_320.text_ = (char *)0x0;
          local_320.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0 to max, ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                     &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
        }
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    if (0 < *(int *)(this + 0x84)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1d8.text_ = (char *)0x0;
      local_1d8.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      local_290.text_ = (char *)0x0;
      local_290.size_ = -1;
      local_2c0.text_ = (char *)0x0;
      local_2c0.size_ = -1;
      local_2f0.text_ = (char *)0x0;
      local_2f0.size_ = -1;
      local_320.text_ = (char *)0x0;
      local_1a8.text_ = prefix._M_dataplus._M_p;
      local_320.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_230.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                 &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
      for (lVar8 = 0; lVar8 < *(int *)(this + 0x84); lVar8 = lVar8 + 1) {
        CEscape(&local_e8,*(string **)(*(long *)(this + 0x60) + lVar8 * 8));
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_260.text_ = (char *)0x0;
        local_260.size_ = -1;
        local_290.text_ = (char *)0x0;
        local_290.size_ = -1;
        local_2c0.text_ = (char *)0x0;
        local_2c0.size_ = -1;
        local_2f0.text_ = (char *)0x0;
        local_2f0.size_ = -1;
        local_320.text_ = (char *)0x0;
        local_1a8.text_ = local_e8._M_dataplus._M_p;
        local_320.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_1a8.size_ = (_Rb_tree_color)local_e8._M_string_length;
        local_230.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"\"$0\", ",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,
                   &local_290,&local_2c0,&local_2f0,&local_320,&local_230);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_1d8.text_ = (char *)0x0;
    local_1d8.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_260.text_ = (char *)0x0;
    local_260.size_ = -1;
    local_290.text_ = (char *)0x0;
    local_290.size_ = -1;
    local_2c0.text_ = (char *)0x0;
    local_2c0.size_ = -1;
    local_2f0.text_ = (char *)0x0;
    local_2f0.size_ = -1;
    local_320.text_ = (char *)0x0;
    local_1a8.text_ = prefix._M_dataplus._M_p;
    local_320.size_ = -1;
    local_230.text_ = (char *)0x0;
    local_1a8.size_ = (_Rb_tree_color)prefix._M_string_length;
    local_230.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_1a8,&local_148,&local_1d8,&local_178,&local_260,&local_290,
               &local_2c0,&local_2f0,&local_320,&local_230);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    std::
    _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Rb_tree(&groups._M_t);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
    std::__cxx11::string::~string((string *)&prefix);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n", prefix,
                              extension_range(i)->start,
                              extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        strings::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}